

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O2

void __thiscall
S2ClosestEdgeQueryBase<S2MaxDistance>::ProcessEdges
          (S2ClosestEdgeQueryBase<S2MaxDistance> *this,QueueEntry *entry)

{
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_00;
  int iVar1;
  const_reference pvVar2;
  undefined4 extraout_var;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar3;
  size_type_conflict n;
  long lVar4;
  int j;
  ulong uVar5;
  
  this_00 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)entry->index_cell
  ;
  for (n = 0; n < (*(uint *)this_00 & 0xffffff); n = n + 1) {
    pvVar2 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                       (this_00,n);
    iVar1 = (*this->index_->_vptr_S2ShapeIndex[3])(this->index_,(ulong)(uint)pvVar2->shape_id_);
    lVar4 = 0;
    for (uVar5 = 0; uVar5 < *(uint *)&pvVar2->field_0x4 >> 1; uVar5 = uVar5 + 1) {
      paVar3 = &pvVar2->field_3;
      if (5 < *(uint *)&pvVar2->field_0x4) {
        paVar3 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(pvVar2->field_3).edges_;
      }
      MaybeAddResult(this,(S2Shape *)CONCAT44(extraout_var,iVar1),*(int *)((long)paVar3 + lVar4));
      lVar4 = lVar4 + 4;
    }
  }
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::ProcessEdges(const QueueEntry& entry) {
  const S2ShapeIndexCell* index_cell = entry.index_cell;
  for (int s = 0; s < index_cell->num_clipped(); ++s) {
    const S2ClippedShape& clipped = index_cell->clipped(s);
    const S2Shape* shape = index_->shape(clipped.shape_id());
    for (int j = 0; j < clipped.num_edges(); ++j) {
      MaybeAddResult(*shape, clipped.edge(j));
    }
  }
}